

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::Scene::getHoveredObject
          (Scene *this,Vector2D *p,bool getElement,bool transformed)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  int pickID;
  uchar color [4];
  undefined4 local_38;
  uint3 local_34;
  
  glClearColor(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  glClear(0x4100);
  glPushAttrib(0xfffff);
  glDisable(0xb50);
  glDisable(0xbe2);
  local_38 = 0;
  p_Var3 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      plVar2 = *(long **)(p_Var3 + 1);
      if (*(char *)((long)plVar2 + 0xea) == '\x01') {
        (**(code **)(*plVar2 + 0x48))(plVar2,&local_38,transformed);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  glReadPixels((int)p->x,(int)p->y,1,1,0x1908,0x1401,&local_34);
  (this->hovered).coordinates.x = 0.0;
  (this->hovered).coordinates.y = 0.0;
  (this->hovered).object = (SceneObject *)0x0;
  (this->hovered).element = (HalfedgeElement *)0x0;
  (this->hovered).coordinates.z = 0.0;
  (this->hovered).axis = None;
  for (p_Var4 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    (**(code **)(**(long **)(p_Var4 + 1) + 0x50))(*(long **)(p_Var4 + 1),(ulong)local_34,this);
  }
  if (!getElement) {
    (this->hovered).element = (HalfedgeElement *)0x0;
  }
  glPopAttrib();
  return;
}

Assistant:

void Scene::getHoveredObject(const Vector2D &p, bool getElement,
                             bool transformed) {
  // Set the background color to the maximum possible value---this value should
  // be far
  // beyond the maximum pick index, since we have at most 2^(8+8+8) = 16,777,216
  // distinct IDs
  glClearColor(1., 1., 1., 1.);

  // Clear any color values currently in the color buffer---we do not want to
  // use these for
  // picking, since they represent, e.g., shading colors rather than pick IDs.
  // Also clear
  // the depth buffer so that we can use it to determine the closest object
  // under the cursor.
  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  // We want to draw the pick IDs as raw color values; shading functionality
  // like lighting and blending shouldn't interfere.
  glPushAttrib(GL_ALL_ATTRIB_BITS);
  glDisable(GL_LIGHTING);
  glDisable(GL_BLEND);

  // Keep track of the number of picking IDs used so far
  int pickID = 0;

  for (auto o : objects) {
    if (o->isPickable) {
      // The implementation of draw_pick MUST increment the
      // pickID for each new pickable element it draws.
      o->draw_pick(pickID, transformed);
    }
  }

  unsigned char color[4];
  glReadPixels(p.x, p.y, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, color);

  int ID = RGBToIndex(color[0], color[1], color[2]);

  // By default, set hovered object to "none"
  hovered.clear();

  // Determine which element generated this pick ID
  int i = 0;
  for (auto o : objects) {
    // Call the object's method for setting the selection
    // based on the ID.  (This allows the object to set
    // the selection to an element within that particular
    // object type, e.g., for a mesh it can specify that a
    // particular vertex is selected, or for a camera it might
    // specify that a control handle was selected, etc.)
    o->setSelection(ID, hovered);

    i++;
  }

  if (!getElement) {
    // Discard element information
    hovered.element = NULL;
  }

  // Restore any draw state that we disabled above.
  glPopAttrib();
}